

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::IsBoolScalarOrVectorType(ValidationState_t *this,uint32_t id)

{
  uint16_t uVar1;
  bool bVar2;
  uint32_t id_00;
  Instruction *pIVar3;
  
  pIVar3 = FindDef(this,id);
  if (pIVar3 != (Instruction *)0x0) {
    uVar1 = (pIVar3->inst_).opcode;
    if (uVar1 == 0x14) {
      return true;
    }
    if (uVar1 == 0x17) {
      id_00 = GetComponentType(this,id);
      bVar2 = IsBoolScalarType(this,id_00);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsBoolScalarOrVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeBool) {
    return true;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsBoolScalarType(GetComponentType(id));
  }

  return false;
}